

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

void __thiscall re2c::Node::~Node(Node *this)

{
  path_t *this_00;
  Node *this_local;
  
  this_00 = this->suffix;
  if (this_00 != (path_t *)0x0) {
    path_t::~path_t(this_00);
    operator_delete(this_00,0x38);
  }
  std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::~set
            (&this->reachable);
  std::
  map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
  ::~map(&this->arcsets);
  std::
  map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&this->arcs);
  return;
}

Assistant:

Node::~Node ()
{
	delete suffix;
}